

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ms_gauden.c
# Opt level: O1

void gauden_dump_ind(gauden_t *g,int senidx)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (0 < g->n_feat) {
    uVar2 = 0;
    do {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
              ,0x4b,"Codebook %d, Feature %d (%dx%d):\n",(ulong)(uint)senidx,uVar2 & 0xffffffff,
              (ulong)(uint)g->n_density,(ulong)(uint)g->featlen[uVar2]);
      if (0 < g->n_density) {
        uVar3 = 0;
        do {
          printf("m[%3d]",uVar3 & 0xffffffff);
          if (0 < g->featlen[uVar2]) {
            lVar1 = 0;
            do {
              printf(" %7.4f",(double)(float)g->mean[senidx][uVar2][uVar3][lVar1]);
              lVar1 = lVar1 + 1;
            } while (lVar1 < g->featlen[uVar2]);
          }
          putchar(10);
          uVar3 = uVar3 + 1;
        } while ((long)uVar3 < (long)g->n_density);
      }
      putchar(10);
      if (0 < g->n_density) {
        uVar3 = 0;
        do {
          printf("v[%3d]",uVar3 & 0xffffffff);
          if (0 < g->featlen[uVar2]) {
            lVar1 = 0;
            do {
              printf(" %d",(ulong)(uint)(int)(float)g->var[senidx][uVar2][uVar3][lVar1]);
              lVar1 = lVar1 + 1;
            } while (lVar1 < g->featlen[uVar2]);
          }
          putchar(10);
          uVar3 = uVar3 + 1;
        } while ((long)uVar3 < (long)g->n_density);
      }
      putchar(10);
      if (0 < g->n_density) {
        uVar3 = 0;
        do {
          printf("d[%3d] %d\n",uVar3 & 0xffffffff,
                 (ulong)(uint)(int)(float)g->det[senidx][uVar2][uVar3]);
          uVar3 = uVar3 + 1;
        } while ((long)uVar3 < (long)g->n_density);
      }
      uVar2 = uVar2 + 1;
    } while ((long)uVar2 < (long)g->n_feat);
  }
  fflush(_stderr);
  return;
}

Assistant:

void
gauden_dump_ind(const gauden_t * g, int senidx)
{
    int32 f, d, i;

    for (f = 0; f < g->n_feat; f++) {
        E_INFO("Codebook %d, Feature %d (%dx%d):\n",
               senidx, f, g->n_density, g->featlen[f]);

        for (d = 0; d < g->n_density; d++) {
            printf("m[%3d]", d);
            for (i = 0; i < g->featlen[f]; i++)
                printf(" %7.4f", MFCC2FLOAT(g->mean[senidx][f][d][i]));
            printf("\n");
        }
        printf("\n");

        for (d = 0; d < g->n_density; d++) {
            printf("v[%3d]", d);
            for (i = 0; i < g->featlen[f]; i++)
                printf(" %d", (int)g->var[senidx][f][d][i]);
            printf("\n");
        }
        printf("\n");

        for (d = 0; d < g->n_density; d++)
            printf("d[%3d] %d\n", d, (int)g->det[senidx][f][d]);
    }
    fflush(stderr);
}